

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O0

void __thiscall
cfd::TransactionContext::SplitTxOut
          (TransactionContext *this,uint32_t index,
          vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *amount_list,
          vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *address_list)

{
  bool bVar1;
  undefined8 in_RCX;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *in_RDI;
  Address *addr;
  const_iterator __end1;
  const_iterator __begin1;
  vector<cfd::core::Address,_std::allocator<cfd::core::Address>_> *__range1;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> locking_script_list;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *in_stack_00000218;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *in_stack_00000220;
  uint32_t in_stack_0000022c;
  TransactionContext *in_stack_00000230;
  Script *in_stack_ffffffffffffff60;
  Script *in_stack_ffffffffffffff68;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *in_stack_ffffffffffffff70;
  __normal_iterator<const_cfd::core::Address_*,_std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>_>
  local_48;
  undefined8 local_40;
  undefined8 local_20;
  
  local_20 = in_RCX;
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::vector
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)0x3aea0c);
  local_40 = local_20;
  local_48._M_current =
       (Address *)
       std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::begin(in_RDI);
  std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_cfd::core::Address_*,_std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>_>
                        *)in_stack_ffffffffffffff60,
                       (__normal_iterator<const_cfd::core::Address_*,_std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_cfd::core::Address_*,_std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>_>
    ::operator*(&local_48);
    cfd::core::Address::GetLockingScript();
    std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::
    emplace_back<cfd::core::Script>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    core::Script::~Script(in_stack_ffffffffffffff60);
    __gnu_cxx::
    __normal_iterator<const_cfd::core::Address_*,_std::vector<cfd::core::Address,_std::allocator<cfd::core::Address>_>_>
    ::operator++(&local_48);
  }
  SplitTxOut(in_stack_00000230,in_stack_0000022c,in_stack_00000220,in_stack_00000218);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector
            (in_stack_ffffffffffffff70);
  return;
}

Assistant:

void TransactionContext::SplitTxOut(
    uint32_t index, const std::vector<Amount>& amount_list,
    const std::vector<Address>& address_list) {
  std::vector<Script> locking_script_list;
  for (const auto& addr : address_list) {
    locking_script_list.emplace_back(addr.GetLockingScript());
  }
  SplitTxOut(index, amount_list, locking_script_list);
}